

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_div_mpi(mbedtls_mpi *Q,mbedtls_mpi *R,mbedtls_mpi *A,mbedtls_mpi *B)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  mbedtls_mpi_uint mVar8;
  size_t count;
  undefined1 auVar9 [16];
  ulong local_e0;
  mbedtls_mpi T1;
  mbedtls_mpi Y;
  mbedtls_mpi X;
  mbedtls_mpi Z;
  mbedtls_mpi T2;
  
  iVar2 = mbedtls_mpi_cmp_int(B,0);
  if (iVar2 == 0) {
    return -0xc;
  }
  iVar3 = 1;
  X.n = 0;
  X.p = (mbedtls_mpi_uint *)0x0;
  Y.n = 0;
  Y.p = (mbedtls_mpi_uint *)0x0;
  Z.n = 0;
  Z.p = (mbedtls_mpi_uint *)0x0;
  T1.n = 0;
  T1.p = (mbedtls_mpi_uint *)0x0;
  T2.n = 0;
  T2.p = (mbedtls_mpi_uint *)0x0;
  T1.s = iVar3;
  Y.s = iVar3;
  X.s = iVar3;
  Z.s = iVar3;
  T2.s = iVar3;
  iVar2 = mbedtls_mpi_cmp_abs(A,B);
  if (iVar2 < 0) {
    if ((Q == (mbedtls_mpi *)0x0) || (iVar2 = mbedtls_mpi_lset(Q,0), iVar2 == 0)) {
      if (R == (mbedtls_mpi *)0x0) {
        return 0;
      }
      iVar2 = mbedtls_mpi_copy(R,A);
      if (iVar2 == 0) {
        return 0;
      }
    }
  }
  else {
    iVar2 = mbedtls_mpi_copy(&X,A);
    if ((((iVar2 == 0) && (iVar2 = mbedtls_mpi_copy(&Y,B), iVar2 == 0)) &&
        (Y.s = iVar3, X.s = iVar3, iVar2 = mbedtls_mpi_grow(&Z,A->n + 2), iVar2 == 0)) &&
       (((iVar2 = mbedtls_mpi_lset(&Z,0), iVar2 == 0 &&
         (iVar2 = mbedtls_mpi_grow(&T1,2), iVar2 == 0)) &&
        (iVar2 = mbedtls_mpi_grow(&T2,3), iVar2 == 0)))) {
      sVar4 = mbedtls_mpi_bitlen(&Y);
      uVar6 = (ulong)((uint)sVar4 & 0x3f);
      if (uVar6 == 0x3f) {
        sVar4 = 0;
      }
      else {
        sVar4 = uVar6 ^ 0x3f;
        iVar2 = mbedtls_mpi_shift_l(&X,sVar4);
        if ((iVar2 != 0) || (iVar2 = mbedtls_mpi_shift_l(&Y,sVar4), iVar2 != 0)) goto LAB_0015e3c8;
      }
      sVar1 = Y.n;
      local_e0 = X.n;
      lVar5 = X.n - Y.n;
      count = lVar5 * 0x40;
      iVar2 = mbedtls_mpi_shift_l(&Y,count);
      if (iVar2 == 0) {
        do {
          iVar2 = mbedtls_mpi_cmp_mpi(&X,&Y);
          if (iVar2 < 0) {
            iVar2 = mbedtls_mpi_shift_r(&Y,count);
            if (iVar2 == 0) {
              goto LAB_0015e460;
            }
            break;
          }
          Z.p[lVar5] = Z.p[lVar5] + 1;
          iVar2 = mbedtls_mpi_sub_mpi(&X,&X,&Y);
        } while (iVar2 == 0);
      }
    }
  }
  goto LAB_0015e3c8;
LAB_0015e460:
  uVar6 = local_e0 - 1;
  if (sVar1 - 1 < uVar6) {
    uVar7 = 0xffffffffffffffff;
    if (X.p[local_e0 - 1] < Y.p[sVar1 - 1]) {
      auVar9 = __udivti3(X.p[local_e0 - 2],X.p[local_e0 - 1],Y.p[sVar1 - 1],0);
      uVar7 = -(ulong)(auVar9._8_8_ != 0) | auVar9._0_8_;
    }
    Z.p[local_e0 + ~sVar1] = uVar7;
    lVar5 = local_e0 + ~sVar1;
    Z.p[lVar5] = Z.p[lVar5] + 1;
    do {
      Z.p[lVar5] = Z.p[lVar5] - 1;
      iVar2 = mbedtls_mpi_lset(&T1,0);
      if (iVar2 != 0) goto LAB_0015e3c8;
      if (sVar1 == 1) {
        mVar8 = 0;
      }
      else {
        mVar8 = Y.p[sVar1 - 2];
      }
      *T1.p = mVar8;
      T1.p[1] = Y.p[sVar1 - 1];
      iVar2 = mbedtls_mpi_mul_int(&T1,&T1,Z.p[lVar5]);
      if ((iVar2 != 0) || (iVar2 = mbedtls_mpi_lset(&T2,0), iVar2 != 0)) goto LAB_0015e3c8;
      if (uVar6 < 2) {
        mVar8 = 0;
      }
      else {
        mVar8 = X.p[local_e0 - 3];
      }
      *T2.p = mVar8;
      T2.p[1] = X.p[local_e0 - 2];
      T2.p[2] = X.p[local_e0 - 1];
      iVar2 = mbedtls_mpi_cmp_mpi(&T1,&T2);
    } while (0 < iVar2);
    iVar2 = mbedtls_mpi_mul_int(&T1,&Y,Z.p[lVar5]);
    if (iVar2 != 0) goto LAB_0015e3c8;
    iVar2 = mbedtls_mpi_shift_l(&T1,lVar5 * 0x40);
    if ((iVar2 != 0) || (iVar2 = mbedtls_mpi_sub_mpi(&X,&X,&T1), iVar2 != 0)) goto LAB_0015e3c8;
    iVar2 = mbedtls_mpi_cmp_int(&X,0);
    local_e0 = uVar6;
    if (iVar2 < 0) {
      iVar2 = mbedtls_mpi_copy(&T1,&Y);
      if (((iVar2 != 0) || (iVar2 = mbedtls_mpi_shift_l(&T1,lVar5 * 0x40), iVar2 != 0)) ||
         (iVar2 = mbedtls_mpi_add_mpi(&X,&X,&T1), iVar2 != 0)) goto LAB_0015e3c8;
      Z.p[lVar5] = Z.p[lVar5] - 1;
    }
    goto LAB_0015e460;
  }
  if (Q != (mbedtls_mpi *)0x0) {
    iVar2 = mbedtls_mpi_copy(Q,&Z);
    if (iVar2 != 0) goto LAB_0015e3c8;
    Q->s = B->s * A->s;
  }
  if (R == (mbedtls_mpi *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = mbedtls_mpi_shift_r(&X,sVar4);
    if (iVar2 == 0) {
      X.s = A->s;
      iVar2 = mbedtls_mpi_copy(R,&X);
      if (iVar2 == 0) {
        iVar2 = 0;
        iVar3 = mbedtls_mpi_cmp_int(R,0);
        if (iVar3 == 0) {
          R->s = 1;
        }
      }
    }
  }
LAB_0015e3c8:
  mbedtls_mpi_free(&X);
  mbedtls_mpi_free(&Y);
  mbedtls_mpi_free(&Z);
  mbedtls_mpi_free(&T1);
  mbedtls_mpi_free(&T2);
  return iVar2;
}

Assistant:

int mbedtls_mpi_div_mpi( mbedtls_mpi *Q, mbedtls_mpi *R, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret;
    size_t i, n, t, k;
    mbedtls_mpi X, Y, Z, T1, T2;

    if( mbedtls_mpi_cmp_int( B, 0 ) == 0 )
        return( MBEDTLS_ERR_MPI_DIVISION_BY_ZERO );

    mbedtls_mpi_init( &X ); mbedtls_mpi_init( &Y ); mbedtls_mpi_init( &Z );
    mbedtls_mpi_init( &T1 ); mbedtls_mpi_init( &T2 );

    if( mbedtls_mpi_cmp_abs( A, B ) < 0 )
    {
        if( Q != NULL ) MBEDTLS_MPI_CHK( mbedtls_mpi_lset( Q, 0 ) );
        if( R != NULL ) MBEDTLS_MPI_CHK( mbedtls_mpi_copy( R, A ) );
        return( 0 );
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &X, A ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Y, B ) );
    X.s = Y.s = 1;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &Z, A->n + 2 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &Z,  0 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &T1, 2 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( &T2, 3 ) );

    k = mbedtls_mpi_bitlen( &Y ) % biL;
    if( k < biL - 1 )
    {
        k = biL - 1 - k;
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &X, k ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &Y, k ) );
    }
    else k = 0;

    n = X.n - 1;
    t = Y.n - 1;
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &Y, biL * ( n - t ) ) );

    while( mbedtls_mpi_cmp_mpi( &X, &Y ) >= 0 )
    {
        Z.p[n - t]++;
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &X, &X, &Y ) );
    }
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &Y, biL * ( n - t ) ) );

    for( i = n; i > t ; i-- )
    {
        if( X.p[i] >= Y.p[t] )
            Z.p[i - t - 1] = ~0;
        else
        {
#if defined(MBEDTLS_HAVE_UDBL)
            mbedtls_t_udbl r;

            r  = (mbedtls_t_udbl) X.p[i] << biL;
            r |= (mbedtls_t_udbl) X.p[i - 1];
            r /= Y.p[t];
            if( r > ( (mbedtls_t_udbl) 1 << biL ) - 1 )
                r = ( (mbedtls_t_udbl) 1 << biL ) - 1;

            Z.p[i - t - 1] = (mbedtls_mpi_uint) r;
#else
            /*
             * __udiv_qrnnd_c, from gmp/longlong.h
             */
            mbedtls_mpi_uint q0, q1, r0, r1;
            mbedtls_mpi_uint d0, d1, d, m;

            d  = Y.p[t];
            d0 = ( d << biH ) >> biH;
            d1 = ( d >> biH );

            q1 = X.p[i] / d1;
            r1 = X.p[i] - d1 * q1;
            r1 <<= biH;
            r1 |= ( X.p[i - 1] >> biH );

            m = q1 * d0;
            if( r1 < m )
            {
                q1--, r1 += d;
                while( r1 >= d && r1 < m )
                    q1--, r1 += d;
            }
            r1 -= m;

            q0 = r1 / d1;
            r0 = r1 - d1 * q0;
            r0 <<= biH;
            r0 |= ( X.p[i - 1] << biH ) >> biH;

            m = q0 * d0;
            if( r0 < m )
            {
                q0--, r0 += d;
                while( r0 >= d && r0 < m )
                    q0--, r0 += d;
            }
            r0 -= m;

            Z.p[i - t - 1] = ( q1 << biH ) | q0;
#endif /* MBEDTLS_HAVE_UDBL && !64-bit Apple with Clang 5.0 */
        }

        Z.p[i - t - 1]++;
        do
        {
            Z.p[i - t - 1]--;

            MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &T1, 0 ) );
            T1.p[0] = ( t < 1 ) ? 0 : Y.p[t - 1];
            T1.p[1] = Y.p[t];
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &T1, &T1, Z.p[i - t - 1] ) );

            MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &T2, 0 ) );
            T2.p[0] = ( i < 2 ) ? 0 : X.p[i - 2];
            T2.p[1] = ( i < 1 ) ? 0 : X.p[i - 1];
            T2.p[2] = X.p[i];
        }
        while( mbedtls_mpi_cmp_mpi( &T1, &T2 ) > 0 );

        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &T1, &Y, Z.p[i - t - 1] ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &T1,  biL * ( i - t - 1 ) ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &X, &X, &T1 ) );

        if( mbedtls_mpi_cmp_int( &X, 0 ) < 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &T1, &Y ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &T1, biL * ( i - t - 1 ) ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( &X, &X, &T1 ) );
            Z.p[i - t - 1]--;
        }
    }

    if( Q != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( Q, &Z ) );
        Q->s = A->s * B->s;
    }

    if( R != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &X, k ) );
        X.s = A->s;
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( R, &X ) );

        if( mbedtls_mpi_cmp_int( R, 0 ) == 0 )
            R->s = 1;
    }

cleanup:

    mbedtls_mpi_free( &X ); mbedtls_mpi_free( &Y ); mbedtls_mpi_free( &Z );
    mbedtls_mpi_free( &T1 ); mbedtls_mpi_free( &T2 );

    return( ret );
}